

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds03_heap_erase.cpp
# Opt level: O2

void __thiscall
CP::priority_queue<int,_std::less<int>_>::erase(priority_queue<int,_std::less<int>_> *this,int *v)

{
  ulong uVar1;
  int *piVar2;
  int i;
  ulong idx;
  
  for (idx = 0; uVar1 = this->mSize, idx < uVar1; idx = idx + 1) {
    piVar2 = this->mData;
    if (piVar2[idx] == *v) {
      this->mSize = uVar1 - 1;
      piVar2[idx] = piVar2[uVar1 - 1];
    }
    fixUp(this,idx);
    fixDown(this,idx);
  }
  return;
}

Assistant:

void erase(const T &v) {
        for (int i = 0; i < mSize; ++i) {
            if (mData[i] == v)
                mData[i] = mData[(mSize--) - 1];
            fixUp(i);
            fixDown(i);
        }
    }